

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

void Vec_VecPushInt(Vec_Vec_t *p,int Level,int Entry)

{
  Vec_Int_t *pVVar1;
  int local_1c;
  int i;
  int Entry_local;
  int Level_local;
  Vec_Vec_t *p_local;
  
  if (p->nSize < Level + 1) {
    Vec_PtrGrow((Vec_Ptr_t *)p,Level + 1);
    for (local_1c = p->nSize; local_1c < Level + 1; local_1c = local_1c + 1) {
      pVVar1 = Vec_IntAlloc(0);
      p->pArray[local_1c] = pVVar1;
    }
    p->nSize = Level + 1;
  }
  pVVar1 = Vec_VecEntryInt(p,Level);
  Vec_IntPush(pVVar1,Entry);
  return;
}

Assistant:

static inline void Vec_VecPushInt( Vec_Vec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_IntAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_VecEntryInt(p, Level), Entry );
}